

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O3

void __thiscall Assimp::Exporter::UnregisterExporter(Exporter *this,char *id)

{
  ExporterPimpl *pEVar1;
  int iVar2;
  pointer __dest;
  pointer pEVar3;
  size_t __n;
  
  pEVar1 = this->pimpl;
  if (pEVar1 == (ExporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Exporter.cpp"
                  ,0x213,"void Assimp::Exporter::UnregisterExporter(const char *)");
  }
  __dest = (pEVar1->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (pEVar1->mExporters).
           super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest != pEVar3) {
    __n = (long)pEVar3 - (long)__dest;
    do {
      __n = __n - 0x28;
      iVar2 = strcmp((__dest->mDescription).id,id);
      if (iVar2 == 0) {
        if (__dest + 1 != pEVar3) {
          memmove(__dest,__dest + 1,__n);
          pEVar3 = (pEVar1->mExporters).
                   super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        (pEVar1->mExporters).
        super__Vector_base<Assimp::Exporter::ExportFormatEntry,_std::allocator<Assimp::Exporter::ExportFormatEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish = pEVar3 + -1;
        return;
      }
      __dest = __dest + 1;
    } while (__dest != pEVar3);
  }
  return;
}

Assistant:

void Exporter::UnregisterExporter(const char* id) {
	ai_assert(nullptr != pimpl);
	for (std::vector<ExportFormatEntry>::iterator it = pimpl->mExporters.begin();
            it != pimpl->mExporters.end(); ++it) {
        if (!strcmp((*it).mDescription.id,id)) {
            pimpl->mExporters.erase(it);
            break;
        }
    }
}